

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

size_t xmlDictSetLimit(xmlDictPtr dict,size_t limit)

{
  size_t sVar1;
  
  if (dict != (xmlDictPtr)0x0) {
    sVar1 = dict->limit;
    dict->limit = limit;
    return sVar1;
  }
  return 0;
}

Assistant:

size_t
xmlDictSetLimit(xmlDictPtr dict, size_t limit) {
    size_t ret;

    if (dict == NULL)
	return(0);
    ret = dict->limit;
    dict->limit = limit;
    return(ret);
}